

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawTests.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::anon_unknown_0::ComputeShaderGeneratedSeparateCase::runComputeShader
          (ComputeShaderGeneratedSeparateCase *this)

{
  ostringstream *poVar1;
  DrawMethod DVar2;
  int iVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  int size;
  int size_00;
  int size_01;
  uint uVar6;
  Vector<int,_3> *pVVar7;
  IVec3 commandDispatchSize;
  IVec3 dataBufferDispatchSize;
  IVec3 drawArraysDataBufferDispatchSize;
  Vector<int,_3> local_1ec;
  string local_1e0;
  Vector<int,_3> local_1c0;
  undefined1 local_1b0 [388];
  Vector<int,_3> local_2c;
  long lVar5;
  
  iVar3 = (*((this->super_ComputeShaderGeneratedCase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar3);
  if ((this->super_ComputeShaderGeneratedCase).m_computeCmd == true) {
    local_1ec.m_data[0] = (this->super_ComputeShaderGeneratedCase).m_numDrawCmds;
    local_1ec.m_data[1] = 1;
    local_1ec.m_data[2] = 1;
    uVar6 = local_1ec.m_data[0] * (this->super_ComputeShaderGeneratedCase).m_commandSize;
    (**(code **)(lVar5 + 0x1680))((this->m_computeCmdProgram->m_program).m_program);
    local_1b0._0_8_ =
         ((this->super_ComputeShaderGeneratedCase).super_TestCase.super_TestCase.super_TestNode.
         m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Binding command buffer to binding point ",0x28);
    std::ostream::operator<<(poVar1,0);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
    (**(code **)(lVar5 + 0x48))(0x90d2,0,(this->super_ComputeShaderGeneratedCase).m_cmdBufferID);
    local_1b0._0_8_ =
         ((this->super_ComputeShaderGeneratedCase).super_TestCase.super_TestCase.super_TestNode.
         m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Allocating memory for command buffer, size ",0x2b);
    (anonymous_namespace)::sizeToString_abi_cxx11_
              (&local_1e0,(_anonymous_namespace_ *)(ulong)uVar6,size);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,".",1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
    (**(code **)(lVar5 + 0x150))(0x90d2,(long)(int)uVar6,0,0x88e8);
    local_1b0._0_8_ =
         ((this->super_ComputeShaderGeneratedCase).super_TestCase.super_TestCase.super_TestNode.
         m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Dispatching command compute, size = ",0x24);
    tcu::operator<<((ostream *)poVar1,&local_1ec);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
    (**(code **)(lVar5 + 0x528))
              (local_1ec.m_data[0],local_1ec.m_data._4_8_ & 0xffffffff,local_1ec.m_data[2]);
    dVar4 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar4,"calculate cmd",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDrawTests.cpp"
                    ,0x71f);
  }
  if ((this->super_ComputeShaderGeneratedCase).m_computeData == true) {
    local_2c.m_data[0] = (this->super_ComputeShaderGeneratedCase).m_gridSize;
    local_1ec.m_data[0] = local_2c.m_data[0] + 1;
    local_1ec.m_data[2] = 1;
    local_1ec.m_data[1] = local_1ec.m_data[0];
    local_2c.m_data[1] = local_2c.m_data[0];
    local_2c.m_data[2] = 1;
    DVar2 = (this->super_ComputeShaderGeneratedCase).m_drawMethod;
    pVVar7 = &local_2c;
    if (DVar2 == DRAWMETHOD_DRAWELEMENTS) {
      pVVar7 = &local_1ec;
    }
    local_1c0.m_data[2] = pVVar7->m_data[2];
    local_1c0.m_data._0_8_ = *(undefined8 *)pVVar7->m_data;
    if (DVar2 == DRAWMETHOD_DRAWELEMENTS) {
      iVar3 = local_1ec.m_data[0] * local_1ec.m_data[0] * 4;
    }
    else {
      iVar3 = 0;
      if (DVar2 == DRAWMETHOD_DRAWARRAYS) {
        iVar3 = local_2c.m_data[0] * local_2c.m_data[0] * 0xc;
      }
    }
    (**(code **)(lVar5 + 0x1680))((this->m_computeDataProgram->m_program).m_program);
    local_1b0._0_8_ =
         ((this->super_ComputeShaderGeneratedCase).super_TestCase.super_TestCase.super_TestNode.
         m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Binding data buffer to binding point ",0x25);
    std::ostream::operator<<(poVar1,0);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
    (**(code **)(lVar5 + 0x48))(0x90d2,0,(this->super_ComputeShaderGeneratedCase).m_dataBufferID);
    local_1b0._0_8_ =
         ((this->super_ComputeShaderGeneratedCase).super_TestCase.super_TestCase.super_TestNode.
         m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Allocating memory for data buffer, size ",0x28);
    (anonymous_namespace)::sizeToString_abi_cxx11_
              (&local_1e0,(_anonymous_namespace_ *)(ulong)(uint)(iVar3 << 4),size_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,".",1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
    (**(code **)(lVar5 + 0x150))(0x90d2,(long)(iVar3 << 4),0,0x88e8);
    local_1b0._0_8_ =
         ((this->super_ComputeShaderGeneratedCase).super_TestCase.super_TestCase.super_TestNode.
         m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Dispatching data compute, size = ",0x21);
    tcu::operator<<((ostream *)poVar1,&local_1c0);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
    (**(code **)(lVar5 + 0x528))
              (local_1c0.m_data._0_8_ & 0xffffffff,local_1c0.m_data[1],local_1c0.m_data[2]);
    dVar4 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar4,"calculate data",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDrawTests.cpp"
                    ,0x73b);
  }
  if ((this->super_ComputeShaderGeneratedCase).m_computeIndices == true) {
    local_1ec.m_data[0] = (this->super_ComputeShaderGeneratedCase).m_gridSize;
    local_1ec.m_data[2] = 1;
    local_1ec.m_data[1] = local_1ec.m_data[0];
    uVar6 = local_1ec.m_data[0] * local_1ec.m_data[0] * 0x18;
    if ((this->super_ComputeShaderGeneratedCase).m_drawMethod != DRAWMETHOD_DRAWELEMENTS) {
      uVar6 = 0;
    }
    (**(code **)(lVar5 + 0x1680))((this->m_computeIndicesProgram->m_program).m_program);
    local_1b0._0_8_ =
         ((this->super_ComputeShaderGeneratedCase).super_TestCase.super_TestCase.super_TestNode.
         m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Binding index buffer to binding point ",0x26);
    std::ostream::operator<<(poVar1,0);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
    (**(code **)(lVar5 + 0x48))(0x90d2,0,(this->super_ComputeShaderGeneratedCase).m_indexBufferID);
    local_1b0._0_8_ =
         ((this->super_ComputeShaderGeneratedCase).super_TestCase.super_TestCase.super_TestNode.
         m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Allocating memory for index buffer, size ",0x29);
    (anonymous_namespace)::sizeToString_abi_cxx11_
              (&local_1e0,(_anonymous_namespace_ *)(ulong)uVar6,size_01);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,".",1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
    (**(code **)(lVar5 + 0x150))(0x90d2,(long)(int)uVar6,0,0x88e8);
    local_1b0._0_8_ =
         ((this->super_ComputeShaderGeneratedCase).super_TestCase.super_TestCase.super_TestNode.
         m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Dispatching index compute, size = ",0x22);
    tcu::operator<<((ostream *)poVar1,&local_1ec);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
    (**(code **)(lVar5 + 0x528))
              (local_1ec.m_data[0],local_1ec.m_data._4_8_ & 0xffffffff,local_1ec.m_data[2]);
    dVar4 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar4,"calculate indices",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDrawTests.cpp"
                    ,0x757);
  }
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"post dispatch",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDrawTests.cpp"
                  ,0x75a);
  return;
}

Assistant:

void ComputeShaderGeneratedSeparateCase::runComputeShader (void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	// Compute command

	if (m_computeCmd)
	{
		const int				bindingPoint			= 0;
		const tcu::IVec3		commandDispatchSize		(m_numDrawCmds, 1, 1);
		const int				bufferSize				= m_commandSize * m_numDrawCmds;

		gl.useProgram(m_computeCmdProgram->getProgram());

		// setup buffers

		m_testCtx.getLog() << tcu::TestLog::Message << "Binding command buffer to binding point " << bindingPoint << tcu::TestLog::EndMessage;
		gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, bindingPoint, m_cmdBufferID);

		m_testCtx.getLog() << tcu::TestLog::Message << "Allocating memory for command buffer, size " << sizeToString(bufferSize) << "." << tcu::TestLog::EndMessage;
		gl.bufferData(GL_SHADER_STORAGE_BUFFER, bufferSize, DE_NULL, GL_DYNAMIC_DRAW);

		// calculate

		m_testCtx.getLog() << tcu::TestLog::Message << "Dispatching command compute, size = " << commandDispatchSize << tcu::TestLog::EndMessage;
		gl.dispatchCompute(commandDispatchSize.x(), commandDispatchSize.y(), commandDispatchSize.z());

		glu::checkError(gl.getError(), "calculate cmd", __FILE__, __LINE__);
	}

	// Compute data

	if (m_computeData)
	{
		const int				bindingPoint						= 0;
		const tcu::IVec3		drawElementsDataBufferDispatchSize	(m_gridSize+1, m_gridSize+1, 1);
		const tcu::IVec3		drawArraysDataBufferDispatchSize	(m_gridSize,   m_gridSize,   1);
		const tcu::IVec3		dataBufferDispatchSize				= (m_drawMethod == DRAWMETHOD_DRAWELEMENTS) ? (drawElementsDataBufferDispatchSize) : (drawArraysDataBufferDispatchSize);
		const int				bufferSize							= (int)(calcDrawBufferSize()*sizeof(tcu::Vec4));

		gl.useProgram(m_computeDataProgram->getProgram());

		// setup buffers

		m_testCtx.getLog() << tcu::TestLog::Message << "Binding data buffer to binding point " << bindingPoint << tcu::TestLog::EndMessage;
		gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, bindingPoint, m_dataBufferID);

		m_testCtx.getLog() << tcu::TestLog::Message << "Allocating memory for data buffer, size " << sizeToString(bufferSize) << "." << tcu::TestLog::EndMessage;
		gl.bufferData(GL_SHADER_STORAGE_BUFFER, bufferSize, DE_NULL, GL_DYNAMIC_DRAW);

		// calculate

		m_testCtx.getLog() << tcu::TestLog::Message << "Dispatching data compute, size = " << dataBufferDispatchSize << tcu::TestLog::EndMessage;
		gl.dispatchCompute(dataBufferDispatchSize.x(), dataBufferDispatchSize.y(), dataBufferDispatchSize.z());

		glu::checkError(gl.getError(), "calculate data", __FILE__, __LINE__);
	}

	// Compute indices

	if (m_computeIndices)
	{
		const int				bindingPoint				= 0;
		const tcu::IVec3		indexBufferDispatchSize		(m_gridSize, m_gridSize, 1);
		const int				bufferSize					= (int)(calcIndexBufferSize()*sizeof(deUint32));

		DE_ASSERT(m_drawMethod == DRAWMETHOD_DRAWELEMENTS);

		gl.useProgram(m_computeIndicesProgram->getProgram());

		// setup buffers

		m_testCtx.getLog() << tcu::TestLog::Message << "Binding index buffer to binding point " << bindingPoint << tcu::TestLog::EndMessage;
		gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, bindingPoint, m_indexBufferID);

		m_testCtx.getLog() << tcu::TestLog::Message << "Allocating memory for index buffer, size " << sizeToString(bufferSize) << "." << tcu::TestLog::EndMessage;
		gl.bufferData(GL_SHADER_STORAGE_BUFFER, bufferSize, DE_NULL, GL_DYNAMIC_DRAW);

		// calculate

		m_testCtx.getLog() << tcu::TestLog::Message << "Dispatching index compute, size = " << indexBufferDispatchSize << tcu::TestLog::EndMessage;
		gl.dispatchCompute(indexBufferDispatchSize.x(), indexBufferDispatchSize.y(), indexBufferDispatchSize.z());

		glu::checkError(gl.getError(), "calculate indices", __FILE__, __LINE__);
	}

	glu::checkError(gl.getError(), "post dispatch", __FILE__, __LINE__);
}